

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::auxiliary_vector
          (AttentionalModel<dynet::LSTMBuilder> *this)

{
  uint uVar1;
  size_type sVar2;
  vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
  *this_00;
  reference ppvVar3;
  long in_RDI;
  value_type *in_stack_ffffffffffffffc8;
  
  while( true ) {
    uVar1 = *(uint *)(in_RDI + 0x4b8);
    sVar2 = std::
            vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            ::size((vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                    *)(in_RDI + 0x4a0));
    if (uVar1 < sVar2) break;
    this_00 = (vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
               *)operator_new(0x18);
    memset(this_00,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x170834);
    std::
    vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
    ::push_back(this_00,in_stack_ffffffffffffffc8);
  }
  uVar1 = *(uint *)(in_RDI + 0x4b8);
  *(uint *)(in_RDI + 0x4b8) = uVar1 + 1;
  ppvVar3 = std::
            vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            ::operator[]((vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                          *)(in_RDI + 0x4a0),(ulong)uVar1);
  return *ppvVar3;
}

Assistant:

std::vector<float>* AttentionalModel<Builder>::auxiliary_vector()
{
    while (num_aux_vecs >= aux_vecs.size())
        aux_vecs.push_back(new std::vector<float>());
    // NB, we return the last auxiliary vector, AND increment counter
    return aux_vecs[num_aux_vecs++]; 
}